

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O1

void rf5c68_write_ram(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  rf5c68_state *chip;
  
  uVar1 = *(uint *)((long)info + 0x8c);
  if (offset <= uVar1 && uVar1 - offset != 0) {
    __n = (ulong)(uVar1 - offset);
    if (length + offset <= uVar1) {
      __n = (ulong)length;
    }
    memcpy((void *)((ulong)offset + *(long *)((long)info + 0x90)),data,__n);
    return;
  }
  return;
}

Assistant:

static void rf5c68_write_ram(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	rf5c68_state *chip = (rf5c68_state *)info;
	
	// offset is absolute here
	if (offset >= chip->datasize)
		return;
	if (offset + length > chip->datasize)
		length = chip->datasize - offset;
	
	memcpy(chip->data + offset, data, length);
	
	return;
}